

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-gear.c
# Opt level: O2

void quiver_absorb_num(player *p,object *obj,int *n_add_pack,int *n_to_quiver)

{
  ushort uVar1;
  object *obj_00;
  int iVar2;
  byte bVar3;
  _Bool _Var4;
  _Bool _Var5;
  wchar_t wVar6;
  wchar_t wVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  ulong uVar15;
  int local_64;
  
  _Var4 = tval_is_ammo(obj);
  if ((_Var4) || (_Var5 = flag_has_dbg(obj->flags,6,0x29,"obj->flags","OF_THROWING"), _Var5)) {
    wVar6 = preferred_quiver_slot(obj);
    bVar3 = 0;
    local_64 = 0;
    iVar14 = 0;
    iVar11 = 0;
    for (uVar15 = 0; uVar15 < z_info->quiver_size; uVar15 = uVar15 + 1) {
      obj_00 = p->upkeep->quiver[uVar15];
      if (obj_00 == (object *)0x0) {
        local_64 = local_64 + 1;
        if ((uint)wVar6 == uVar15 || _Var4) {
          iVar14 = iVar14 + (uint)z_info->quiver_slot_size;
        }
      }
      else {
        _Var5 = tval_is_ammo(obj_00);
        uVar12 = 1;
        if (!_Var5) {
          uVar12 = (uint)z_info->thrown_quiver_mult;
        }
        iVar11 = obj_00->number * uVar12 + iVar11;
        _Var5 = object_stackable(obj_00,obj,OSTACK_PACK);
        if (_Var5) {
          uVar12 = uVar12 * obj_00->number;
          if (z_info->quiver_slot_size < uVar12) {
            __assert_fail("quiver_obj->number * mult <= z_info->quiver_slot_size",
                          "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/obj-gear.c"
                          ,0x29e,
                          "void quiver_absorb_num(const struct player *, const struct object *, int *, int *)"
                         );
          }
          iVar14 = (iVar14 - uVar12) + (uint)z_info->quiver_slot_size;
        }
        else if (((uint)wVar6 == uVar15) && (wVar7 = preferred_quiver_slot(obj_00), wVar7 != wVar6))
        {
          uVar12 = uVar12 * obj_00->number;
          if (z_info->quiver_slot_size < uVar12) {
            __assert_fail("quiver_obj->number * mult <= z_info->quiver_slot_size",
                          "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/obj-gear.c"
                          ,0x2ac,
                          "void quiver_absorb_num(const struct player *, const struct object *, int *, int *)"
                         );
          }
          if (_Var4) {
            iVar14 = iVar14 - uVar12;
          }
          iVar14 = iVar14 + (uint)z_info->quiver_slot_size;
          bVar3 = 1;
        }
      }
    }
    if ((iVar14 != 0) && ((bool)(~bVar3 & 1) || (bool)(local_64 != 0 & bVar3))) {
      if (_Var4) {
        uVar12 = 1;
      }
      else {
        uVar12 = (uint)z_info->thrown_quiver_mult;
      }
      uVar1 = z_info->quiver_slot_size;
      uVar10 = iVar11 % (int)(uint)uVar1;
      iVar11 = uVar1 - uVar10;
      if (uVar10 == 0) {
        iVar11 = 0;
      }
      uVar13 = (uint)uVar1;
      iVar8 = 0;
      if (0 < *n_add_pack) {
        iVar8 = *n_add_pack * uVar13;
      }
      iVar2 = iVar8 + iVar11;
      if (iVar14 < iVar8 + iVar11) {
        iVar2 = iVar14;
      }
      uVar9 = iVar2 / (int)uVar12;
      if ((int)(uint)obj->number <= (int)uVar9) {
        uVar9 = (uint)obj->number;
      }
      *n_to_quiver = uVar9;
      *n_add_pack = *n_add_pack - (int)(uVar9 * uVar12 + ~uVar10 + uVar13) / (int)uVar13;
      return;
    }
  }
  *n_to_quiver = 0;
  return;
}

Assistant:

static void quiver_absorb_num(const struct player *p, const struct object *obj,
		int *n_add_pack, int *n_to_quiver)
{
	bool ammo = tval_is_ammo(obj);

	/* Must be ammo or good for throwing */
	if (ammo || of_has(obj->flags, OF_THROWING)) {
		int i, quiver_count = 0, space_free = 0, n_empty = 0;
		int desired_slot = preferred_quiver_slot(obj);
		bool displaces = false;

		/* Count the current space this object could go into. */
		for (i = 0; i < z_info->quiver_size; i++) {
			const struct object *quiver_obj = p->upkeep->quiver[i];
			if (quiver_obj) {
				int mult = tval_is_ammo(quiver_obj) ?
					1 : z_info->thrown_quiver_mult;

				quiver_count += quiver_obj->number * mult;
				if (object_stackable(quiver_obj, obj, OSTACK_PACK)) {
					assert(quiver_obj->number * mult <=
						z_info->quiver_slot_size);
					space_free += z_info->quiver_slot_size -
						quiver_obj->number * mult;
				} else if (desired_slot == i &&
						preferred_quiver_slot(quiver_obj) != i) {
					/*
					 * The object to be added prefers to go
					 * in this slot, but it's occupied by
					 * something that could be displaced
					 * to another quiver slot, if one is
					 * available.
					 */
					displaces = true;
					assert(quiver_obj->number * mult <=
						z_info->quiver_slot_size);
					/*
					 * Avoid double counting in the ammo
					 * case since the empty slot, if any,
					 * for the displaced stack is treated
					 * as fully available.
					 */
					if (ammo) {
						space_free += z_info->quiver_slot_size
							- quiver_obj->number
							* mult;
					} else {
						space_free += z_info->quiver_slot_size;
					}
				}
			} else {
				++n_empty;
				/*
				 * Ammo can fit in any empty slot in the quiver.
				 * Non-ammo throwing items are restricted to
				 * their preferred slot.
				 */
				if (ammo || desired_slot == i) {
					space_free += z_info->quiver_slot_size;
				}
			}
		}

		/*
		 * Only possible to add if there is space free in the quiver
		 * and either are displacing a pile with an empty quiver slot
		 * available for it or are not displacing a pile at all.
		 */
		if (space_free && ((displaces && n_empty) || !displaces)) {
			int mult = ammo ? 1 : z_info->thrown_quiver_mult;
			/*
			 * When quiver_count % quiver_slot_size is zero, adding
			 * anything will require a pack slot.
			 */
			int remainder = quiver_count % z_info->quiver_slot_size;
			int limit_from_pack = (remainder) ?
				z_info->quiver_slot_size - remainder : 0;

			if (*n_add_pack > 0) {
				limit_from_pack += *n_add_pack *
					z_info->quiver_slot_size;
			}

			/* Return the number or amount that fits. */
			space_free = MIN(space_free, limit_from_pack);
			*n_to_quiver = MIN(obj->number, space_free / mult);
			*n_add_pack -= (*n_to_quiver * mult +
				z_info->quiver_slot_size - 1 -
				remainder) / z_info->quiver_slot_size;
			return;
		}
	}

	/* Not suitable for the quiver or no space */
	*n_to_quiver = 0;
}